

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

bool Lexer::isBoundary(int left,int right)

{
  bool bVar1;
  bool bVar2;
  
  if (right != 0) {
    bVar1 = unicodeLatinAlpha(left);
    bVar2 = unicodeLatinAlpha(right);
    if (bVar1 == bVar2) {
      bVar1 = unicodeLatinDigit(left);
      bVar2 = unicodeLatinDigit(right);
      if (bVar1 == bVar2) {
        bVar1 = unicodeWhitespace(left);
        bVar2 = unicodeWhitespace(right);
        if (bVar1 == bVar2) {
          bVar1 = isPunctuation(left);
          if (!bVar1) {
            bVar1 = isPunctuation(right);
            return bVar1;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool Lexer::isBoundary (int left, int right)
{
  // EOS
  if (right == '\0')                                         return true;

  // XOR
  if (unicodeLatinAlpha (left) != unicodeLatinAlpha (right)) return true;
  if (unicodeLatinDigit (left) != unicodeLatinDigit (right)) return true;
  if (unicodeWhitespace (left) != unicodeWhitespace (right)) return true;

  // OR
  if (isPunctuation (left) || isPunctuation (right))         return true;

  return false;
}